

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O3

bool __thiscall SQVM::CLOSURE_OP(SQVM *this,SQObjectPtr *target,SQFunctionProto *func)

{
  SQUnsignedInteger *pSVar1;
  long *plVar2;
  int iVar3;
  uint uVar4;
  SQObjectType SVar5;
  SQSharedState *ss;
  SQOuterVar *pSVar6;
  long lVar7;
  SQObjectPtr *pSVar8;
  SQObjectPtr *pSVar9;
  long *plVar10;
  SQTable *pSVar11;
  SQWeakRef *root;
  SQClosure *pSVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  
  ss = this->_sharedstate;
  root = SQRefCounted::GetWeakRef((this->_roottable).super_SQObject._unVal.pRefCounted,OT_TABLE);
  pSVar12 = SQClosure::Create(ss,func,root);
  lVar15 = func->_noutervalues;
  if (0 < lVar15) {
    lVar14 = 0x20;
    lVar13 = 0;
    do {
      pSVar6 = func->_outervalues;
      iVar3 = *(int *)((long)pSVar6 + lVar14 + -0x20);
      if (iVar3 == 1) {
        pSVar8 = ((this->ci->_closure).super_SQObject._unVal.pClosure)->_outervalues;
        lVar7 = *(long *)((long)&pSVar6->_type + lVar14);
        pSVar9 = pSVar12->_outervalues;
        uVar4 = *(uint *)((long)&(pSVar9->super_SQObject)._type + lVar13);
        plVar10 = *(long **)((long)&(pSVar9->super_SQObject)._unVal + lVar13);
        pSVar11 = pSVar8[lVar7].super_SQObject._unVal.pTable;
        *(SQTable **)((long)&(pSVar9->super_SQObject)._unVal + lVar13) = pSVar11;
        SVar5 = pSVar8[lVar7].super_SQObject._type;
        *(SQObjectType *)((long)&(pSVar9->super_SQObject)._type + lVar13) = SVar5;
        if ((SVar5 >> 0x1b & 1) != 0) {
          pSVar1 = &(pSVar11->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 + 1;
        }
        if ((uVar4 >> 0x1b & 1) != 0) {
          plVar2 = plVar10 + 1;
          *plVar2 = *plVar2 + -1;
          if (*plVar2 == 0) {
            (**(code **)(*plVar10 + 0x10))();
          }
        }
      }
      else if (iVar3 == 0) {
        FindOuter(this,(SQObjectPtr *)
                       ((long)&(pSVar12->_outervalues->super_SQObject)._type + lVar13),
                  (this->_stack)._vals + this->_stackbase + *(long *)((long)&pSVar6->_type + lVar14)
                 );
      }
      lVar13 = lVar13 + 0x10;
      lVar14 = lVar14 + 0x28;
      lVar15 = lVar15 + -1;
    } while (lVar15 != 0);
  }
  lVar15 = func->_ndefaultparams;
  if (0 < lVar15) {
    lVar13 = 0;
    do {
      lVar14 = *(long *)((long)func->_defaultparams + lVar13);
      lVar7 = this->_stackbase;
      pSVar8 = (this->_stack)._vals;
      pSVar9 = pSVar12->_defaultparams;
      uVar4 = *(uint *)((long)&(pSVar9->super_SQObject)._type + lVar13 * 2);
      plVar10 = *(long **)((long)&(pSVar9->super_SQObject)._unVal + lVar13 * 2);
      pSVar11 = pSVar8[lVar7 + lVar14].super_SQObject._unVal.pTable;
      *(SQTable **)((long)&(pSVar9->super_SQObject)._unVal + lVar13 * 2) = pSVar11;
      SVar5 = pSVar8[lVar7 + lVar14].super_SQObject._type;
      *(SQObjectType *)((long)&(pSVar9->super_SQObject)._type + lVar13 * 2) = SVar5;
      if ((SVar5 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar11->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      if ((uVar4 >> 0x1b & 1) != 0) {
        plVar2 = plVar10 + 1;
        *plVar2 = *plVar2 + -1;
        if (*plVar2 == 0) {
          (**(code **)(*plVar10 + 0x10))();
        }
      }
      lVar13 = lVar13 + 8;
      lVar15 = lVar15 + -1;
    } while (lVar15 != 0);
  }
  pSVar11 = (target->super_SQObject)._unVal.pTable;
  SVar5 = (target->super_SQObject)._type;
  (target->super_SQObject)._type = OT_CLOSURE;
  (target->super_SQObject)._unVal.pClosure = pSVar12;
  pSVar1 = &(pSVar12->super_SQCollectable).super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if ((SVar5 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar11->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar11->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])()
      ;
    }
  }
  return true;
}

Assistant:

bool SQVM::CLOSURE_OP(SQObjectPtr &target, SQFunctionProto *func)
{
    SQInteger nouters;
    SQClosure *closure = SQClosure::Create(_ss(this), func,_table(_roottable)->GetWeakRef(OT_TABLE));
    if((nouters = func->_noutervalues)) {
        for(SQInteger i = 0; i<nouters; i++) {
            SQOuterVar &v = func->_outervalues[i];
            switch(v._type){
            case otLOCAL:
                FindOuter(closure->_outervalues[i], &STK(_integer(v._src)));
                break;
            case otOUTER:
                closure->_outervalues[i] = _closure(ci->_closure)->_outervalues[_integer(v._src)];
                break;
            }
        }
    }
    SQInteger ndefparams;
    if((ndefparams = func->_ndefaultparams)) {
        for(SQInteger i = 0; i < ndefparams; i++) {
            SQInteger spos = func->_defaultparams[i];
            closure->_defaultparams[i] = _stack._vals[_stackbase + spos];
        }
    }
    target = closure;
    return true;

}